

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O0

void duckdb::RepeatListFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  anon_class_32_4_1eb07289 fun;
  reference pvVar1;
  reference pvVar2;
  Vector *result_00;
  Vector *right;
  Vector *left;
  Vector *in_RDX;
  DataChunk *in_RDI;
  idx_t current_size;
  Vector *result_child;
  Vector *source_child;
  value_type *cnt_vector;
  value_type *list_vector;
  size_type in_stack_ffffffffffffff68;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff70;
  
  pvVar1 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  result_00 = (Vector *)duckdb::ListVector::GetEntry(pvVar1);
  right = (Vector *)duckdb::ListVector::GetEntry(in_RDX);
  left = (Vector *)duckdb::ListVector::GetListSize(in_RDX);
  DataChunk::size(in_RDI);
  fun.result = pvVar2;
  fun.current_size = (idx_t *)result_00;
  fun.source_child = pvVar1;
  fun.result_child = in_RDX;
  BinaryExecutor::
  Execute<duckdb::list_entry_t,long,duckdb::list_entry_t,duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            (left,right,result_00,(idx_t)in_RDX,fun);
  duckdb::ListVector::SetListSize(in_RDX,(ulong)left);
  return;
}

Assistant:

static void RepeatListFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &list_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	auto &source_child = ListVector::GetEntry(list_vector);
	auto &result_child = ListVector::GetEntry(result);

	idx_t current_size = ListVector::GetListSize(result);
	BinaryExecutor::Execute<list_entry_t, int64_t, list_entry_t>(
	    list_vector, cnt_vector, result, args.size(), [&](list_entry_t list_input, int64_t cnt) {
		    idx_t copy_count = cnt <= 0 || list_input.length == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);
		    idx_t result_length = list_input.length * copy_count;
		    idx_t new_size = current_size + result_length;
		    ListVector::Reserve(result, new_size);
		    list_entry_t result_list;
		    result_list.offset = current_size;
		    result_list.length = result_length;
		    for (idx_t i = 0; i < copy_count; i++) {
			    // repeat the list contents "cnt" times
			    VectorOperations::Copy(source_child, result_child, list_input.offset + list_input.length,
			                           list_input.offset, current_size);
			    current_size += list_input.length;
		    }
		    return result_list;
	    });
	ListVector::SetListSize(result, current_size);
}